

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_utils.cpp
# Opt level: O2

string * jsonnet::internal::path_dir_with_trailing_separator
                   (string *__return_storage_ptr__,string *path)

{
  long lVar1;
  allocator<char> local_11;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)path,0x205f70);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string path_dir_with_trailing_separator(const std::string &path) {
    size_t last_slash = path.find_last_of(DIR_SEPARATORS);
    if (last_slash != std::string::npos) {
        return path.substr(0, last_slash + 1);
    }
    return "";
}